

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMParserList.cpp
# Opt level: O0

PCMParserList * __thiscall ASDCP::PCMParserList::Reset(PCMParserList *this)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  bool bVar3;
  WAVParser local_b0 [7];
  __normal_iterator<ASDCP::ParserInstance_**,_std::vector<ASDCP::ParserInstance_*,_std::allocator<ASDCP::ParserInstance_*>_>_>
  local_38;
  ParserInstance **local_30;
  __normal_iterator<ASDCP::ParserInstance_**,_std::vector<ASDCP::ParserInstance_*,_std::allocator<ASDCP::ParserInstance_*>_>_>
  local_28;
  iterator self_i;
  PCMParserList *this_local;
  Result_t *result;
  
  self_i._M_current._7_1_ = 0;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  __gnu_cxx::
  __normal_iterator<ASDCP::ParserInstance_**,_std::vector<ASDCP::ParserInstance_*,_std::allocator<ASDCP::ParserInstance_*>_>_>
  ::__normal_iterator(&local_28);
  local_30 = (ParserInstance **)
             std::vector<ASDCP::ParserInstance_*,_std::allocator<ASDCP::ParserInstance_*>_>::begin
                       ((vector<ASDCP::ParserInstance_*,_std::allocator<ASDCP::ParserInstance_*>_> *
                        )(in_RSI + 8));
  local_28._M_current = local_30;
  while( true ) {
    local_38._M_current =
         (ParserInstance **)
         std::vector<ASDCP::ParserInstance_*,_std::allocator<ASDCP::ParserInstance_*>_>::end
                   ((vector<ASDCP::ParserInstance_*,_std::allocator<ASDCP::ParserInstance_*>_> *)
                    (in_RSI + 8));
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    bVar3 = false;
    if (bVar1) {
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      bVar3 = -1 < iVar2;
    }
    if (!bVar3) break;
    __gnu_cxx::
    __normal_iterator<ASDCP::ParserInstance_**,_std::vector<ASDCP::ParserInstance_*,_std::allocator<ASDCP::ParserInstance_*>_>_>
    ::operator*(&local_28);
    PCM::WAVParser::Reset(local_b0);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b0);
    Kumu::Result_t::~Result_t((Result_t *)local_b0);
    __gnu_cxx::
    __normal_iterator<ASDCP::ParserInstance_**,_std::vector<ASDCP::ParserInstance_*,_std::allocator<ASDCP::ParserInstance_*>_>_>
    ::operator++(&local_28,0);
  }
  return this;
}

Assistant:

Result_t
ASDCP::PCMParserList::Reset()
{
  Result_t result = RESULT_OK;
  PCMParserList::iterator self_i;

  for ( self_i = begin(); self_i != end() && ASDCP_SUCCESS(result) ; self_i++ )
    result = (*self_i)->Parser.Reset();

  return result;
}